

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O1

int pageant_delete_all_keys(char **retstr)

{
  uint uVar1;
  PageantClientOp *pPVar2;
  int iVar3;
  char *pcVar4;
  
  pPVar2 = pageant_client_op_new();
  BinarySink_put_byte(pPVar2->binarysink_,'\x13');
  uVar1 = pageant_client_op_query(pPVar2);
  pageant_client_op_free(pPVar2);
  if (uVar1 == 6) {
    pPVar2 = pageant_client_op_new();
    BinarySink_put_byte(pPVar2->binarysink_,'\t');
    uVar1 = pageant_client_op_query(pPVar2);
    pageant_client_op_free(pPVar2);
    if (uVar1 == 6) {
      pcVar4 = (char *)0x0;
      iVar3 = 0;
      goto LAB_001154fe;
    }
    pcVar4 = "Agent failed to delete SSH-1 keys";
  }
  else {
    pcVar4 = "Agent failed to delete SSH-2 keys";
  }
  pcVar4 = dupstr(pcVar4);
  iVar3 = 1;
LAB_001154fe:
  *retstr = pcVar4;
  return iVar3;
}

Assistant:

int pageant_delete_all_keys(char **retstr)
{
    PageantClientOp *pco;
    unsigned reply;

    pco = pageant_client_op_new();
    put_byte(pco, SSH2_AGENTC_REMOVE_ALL_IDENTITIES);
    reply = pageant_client_op_query(pco);
    pageant_client_op_free(pco);
    if (reply != SSH_AGENT_SUCCESS) {
        *retstr = dupstr("Agent failed to delete SSH-2 keys");
        return PAGEANT_ACTION_FAILURE;
    }

    pco = pageant_client_op_new();
    put_byte(pco, SSH1_AGENTC_REMOVE_ALL_RSA_IDENTITIES);
    reply = pageant_client_op_query(pco);
    pageant_client_op_free(pco);
    if (reply != SSH_AGENT_SUCCESS) {
        *retstr = dupstr("Agent failed to delete SSH-1 keys");
        return PAGEANT_ACTION_FAILURE;
    }

    *retstr = NULL;
    return PAGEANT_ACTION_OK;
}